

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionBody *
Js::FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo *parseableFunctionInfo)

{
  NestedArray *pNVar1;
  Recycler *alloc;
  FunctionBody *this;
  FunctionInfo *nestedFunc;
  undefined8 uVar2;
  Type TVar3;
  uint i;
  uint index;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pNVar1 = (parseableFunctionInfo->nestedArray).ptr;
  index = 0;
  TVar3 = 0;
  if (pNVar1 != (NestedArray *)0x0) {
    TVar3 = pNVar1->nestedCount;
  }
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x1fa;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((parseableFunctionInfo->super_FunctionProxy).m_scriptContext)->recycler,
                     (TrackAllocData *)local_50);
  uVar2 = 0;
  this = (FunctionBody *)new<Memory::Recycler>(0x1e8,alloc,0x6da320);
  FunctionBody(this,parseableFunctionInfo);
  for (; TVar3 != index; index = index + 1) {
    nestedFunc = ParseableFunctionInfo::GetNestedFunc(parseableFunctionInfo,index);
    ParseableFunctionInfo::SetNestedFunc
              ((ParseableFunctionInfo *)this,nestedFunc,index,(uint32)uVar2);
  }
  return this;
}

Assistant:

FunctionBody *
    FunctionBody::NewFromParseableFunctionInfo(ParseableFunctionInfo * parseableFunctionInfo)
    {
        ScriptContext * scriptContext = parseableFunctionInfo->GetScriptContext();
        uint nestedCount = parseableFunctionInfo->GetNestedCount();

        FunctionBody * functionBody = RecyclerNewWithBarrierFinalized(scriptContext->GetRecycler(),
            FunctionBody,
            parseableFunctionInfo);

        // Initialize nested function array, update back pointers
        for (uint i = 0; i < nestedCount; i++)
        {
            FunctionInfo * nestedInfo = parseableFunctionInfo->GetNestedFunc(i);
            functionBody->SetNestedFunc(nestedInfo, i, 0);
        }

        return functionBody;
    }